

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m256v_LU_mult(m256v *LU,int *rp,int *cp,m256v *X,m256v *Y_out)

{
  int iVar1;
  long in_RSI;
  int *in_RDI;
  m256v *in_R8;
  int j_2;
  int j_1;
  int i_2;
  int j;
  int t;
  int i_1;
  int i;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  m256v *in_stack_ffffffffffffff90;
  uint8_t in_stack_ffffffffffffff9b;
  int in_stack_ffffffffffffff9c;
  m256v *in_stack_ffffffffffffffa0;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_30;
  int local_2c;
  
  for (local_2c = 0; local_2c < in_R8->n_row; local_2c = local_2c + 1) {
    m256v_clear_row(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  }
  for (local_30 = 0; local_30 < *in_RDI; local_30 = local_30 + 1) {
    local_38 = in_RDI[1];
    while (local_38 = local_38 + -1, local_30 <= local_38) {
      m256v_get_el(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      m256v_multadd_row(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                        in_stack_ffffffffffffff9b,in_stack_ffffffffffffff90,
                        in_stack_ffffffffffffff8c);
    }
  }
  iVar1 = *in_RDI;
  while (local_3c = iVar1 + -1, -1 < local_3c) {
    if (local_3c < in_RDI[1]) {
      for (local_44 = iVar1 + -2; iVar1 = local_3c, -1 < local_44; local_44 = local_44 + -1) {
        in_stack_ffffffffffffff9c = *(int *)(in_RSI + (long)local_44 * 4);
        in_stack_ffffffffffffff90 = in_R8;
        m256v_get_el(in_R8,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
        m256v_multadd_row(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                          in_stack_ffffffffffffff9b,in_stack_ffffffffffffff90,
                          in_stack_ffffffffffffff8c);
      }
    }
    else {
      local_40 = in_RDI[1];
      while (local_40 = local_40 + -1, iVar1 = local_3c, -1 < local_40) {
        in_stack_ffffffffffffffa0 = in_R8;
        m256v_get_el(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
        m256v_multadd_row(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                          in_stack_ffffffffffffff9b,in_stack_ffffffffffffff90,
                          in_stack_ffffffffffffff8c);
      }
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_LU_mult)(const MV_GEN_TYPE* LU,
		   const int* rp,
		   const int* cp,
		   const MV_GEN_TYPE* X,
		   MV_GEN_TYPE* Y_out)
{
	/* Check dimensions */
	assert(LU->n_col == X->n_row);
	assert(LU->n_row == Y_out->n_row);
	assert(X->n_col == Y_out->n_col);

	/* Clear out the rows in the target vector */
	for (int i = 0; i < Y_out->n_row; ++i) {
		MV_GEN_N(_clear_row)(Y_out, i);
	}

	/* Multiply with U */
	for (int i = 0; i < LU->n_row; ++i) {
		const int t = rp[i];
		for (int j = LU->n_col - 1; j >= i; --j) {
			MV_GEN_N(_multadd_row)(X, cp[j],
					MV_GEN_N(_get_el)(LU, i, j),
					Y_out, t);
		}
	}

	/* Multiply with L */
	for (int i = LU->n_row - 1; i >= 0; --i) {
		if (i >= LU->n_col) {
			/* We're in the rectangle below the triangular part
			 */
			for (int j = LU->n_col - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(Y_out, rp[j],
						MV_GEN_N(_get_el)(LU, i, j),
						Y_out, rp[i]);
			}
		} else {
			/* i < LU->n_col, we're in the triangular part */
			for (int j = i - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(Y_out, rp[j],
						MV_GEN_N(_get_el)(LU, i, j),
						Y_out, rp[i]);
			}
		}
	}
}